

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_background.h
# Opt level: O3

void __thiscall SAUF_BG<TTA>::PerformLabeling(SAUF_BG<TTA> *this)

{
  uint uVar1;
  int iVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint v;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long local_98;
  Mat local_90 [96];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
  uVar10 = *(uint *)&pMVar3->field_0x8;
  uVar1 = *(uint *)&pMVar3->field_0xc;
  cv::Mat::Mat(local_90,**(int **)&pMVar3->field_0x40,(*(int **)&pMVar3->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
  TTA::Alloc((int)((long)*(int *)&pMVar3->field_0xc + 1U >> 1) * (*(int *)&pMVar3->field_0x8 + 1) +
             1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  uVar13 = 1;
  if (0 < (int)uVar10) {
    local_98 = -1;
    uVar11 = 0;
    do {
      if (0 < (int)uVar1) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
        lVar6 = *(long *)&pMVar3->field_0x10;
        lVar16 = **(long **)&pMVar3->field_0x48;
        lVar15 = lVar16 * uVar11 + lVar6;
        lVar9 = *(long *)&pMVar4->field_0x10;
        lVar12 = **(long **)&pMVar4->field_0x48;
        lVar17 = lVar12 * uVar11 + lVar9;
        lVar9 = lVar12 * local_98 + lVar9;
        lVar6 = lVar16 * local_98 + lVar6;
        lVar12 = 0;
        lVar16 = -1;
        do {
          if (*(char *)(lVar15 + 1 + lVar16) == '\0') {
            if ((uVar11 != 0) && (*(char *)(lVar6 + 1 + lVar16) == '\0')) {
              if ((lVar16 == -1) || (*(char *)(lVar15 + lVar16) != '\0')) goto LAB_0022031a;
              uVar13 = *(uint *)(lVar9 + 4 + lVar16 * 4);
              v = *(uint *)(lVar17 + lVar16 * 4);
LAB_0022044a:
              uVar13 = TTA::Merge(uVar13,v);
              goto LAB_002203ea;
            }
            if ((lVar16 != -1) && (*(char *)(lVar15 + lVar16) == '\0')) {
              uVar13 = *(uint *)(lVar17 + lVar16 * 4);
              goto LAB_002203ea;
            }
LAB_002203c8:
            uVar8 = (ulong)TTA::length_;
            TTA::rtable_[uVar8] = TTA::length_;
            TTA::next_[uVar8] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar13 = TTA::length_;
            TTA::length_ = TTA::length_ + 1;
          }
          else {
            if (uVar11 == 0) {
              lVar7 = lVar16;
              if (lVar16 != -1) {
LAB_00220360:
                if (*(char *)(lVar15 + lVar7) != '\0') {
                  uVar13 = *(uint *)(lVar17 + lVar7 * 4);
                  goto LAB_002203ea;
                }
              }
              goto LAB_002203c8;
            }
            if (*(char *)(lVar6 + 1 + lVar16) == '\0') {
              if (((long)(int)uVar1 + -1 <= lVar16 + 1) || (*(char *)(lVar6 + 2 + lVar16) == '\0'))
              {
                if (lVar16 != -1) {
                  if (*(char *)(lVar6 + lVar16) != '\0') {
                    uVar13 = *(uint *)(lVar9 + lVar16 * 4);
                    goto LAB_002203ea;
                  }
                  lVar7 = lVar12 + -1;
                  goto LAB_00220360;
                }
                goto LAB_002203c8;
              }
              if (lVar16 != -1) {
                if (*(char *)(lVar6 + lVar16) == '\0') {
                  if (*(char *)(lVar15 + lVar16) == '\0') goto LAB_0022047f;
                  uVar13 = *(uint *)(lVar17 + lVar16 * 4);
                }
                else {
                  uVar13 = *(uint *)(lVar9 + lVar16 * 4);
                }
                v = *(uint *)(lVar9 + 8 + lVar16 * 4);
                goto LAB_0022044a;
              }
LAB_0022047f:
              uVar13 = *(uint *)(lVar9 + 8 + lVar16 * 4);
            }
            else {
LAB_0022031a:
              uVar13 = *(uint *)(lVar9 + 4 + lVar16 * 4);
            }
          }
LAB_002203ea:
          *(uint *)(lVar17 + 4 + lVar16 * 4) = uVar13;
          lVar12 = lVar12 + 1;
          lVar7 = lVar16 - (ulong)uVar1;
          lVar16 = lVar16 + 1;
        } while (lVar7 != -2);
      }
      puVar5 = TTA::rtable_;
      uVar11 = uVar11 + 1;
      local_98 = local_98 + 1;
    } while (uVar11 != uVar10);
    uVar13 = 1;
    if (1 < TTA::length_) {
      uVar11 = 1;
      do {
        if (uVar11 == puVar5[uVar11]) {
          uVar13 = uVar13 + 1;
          uVar10 = uVar13;
        }
        else {
          uVar10 = puVar5[puVar5[uVar11]];
        }
        puVar5[uVar11] = uVar10;
        uVar11 = uVar11 + 1;
      } while (uVar11 < TTA::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_true>).n_labels_ = uVar13;
  puVar5 = TTA::rtable_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
  iVar14 = *(int *)&pMVar4->field_0x8;
  if (0 < iVar14) {
    lVar6 = *(long *)&pMVar4->field_0x10;
    lVar16 = **(long **)&pMVar4->field_0x48;
    lVar9 = 0;
    do {
      iVar2 = *(int *)&pMVar4->field_0xc;
      if ((long)iVar2 != 0) {
        lVar12 = 0;
        do {
          *(uint *)(lVar6 + lVar12) = puVar5[*(uint *)(lVar6 + lVar12)];
          lVar12 = lVar12 + 4;
        } while ((long)iVar2 * 4 != lVar12);
        iVar14 = *(int *)&pMVar4->field_0x8;
      }
      lVar9 = lVar9 + 1;
      lVar6 = lVar6 + lVar16;
    } while (lVar9 < iVar14);
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Allocation + initialization of the output image

        LabelsSolver::Alloc((size_t)img_.rows * (((size_t)img_.cols + 1) / 2) + ((size_t)img_.cols + 1) / 2 + 1); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const* const img_row = img_.ptr<unsigned char>(r);
            unsigned char const* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
            unsigned* const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const  img_labels_row_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0
#define CONDITION_Q_BG r > 0 && img_row_prev[c] == 0
#define CONDITION_S_BG c > 0 && img_row[c - 1] == 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c], img_labels_row[c - 1]); // x <- p + s

#include "labeling_sauf_bg_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned* img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned* const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }

        LabelsSolver::Dealloc(); // Memory deallocation of the labels solver

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
#undef CONDITION_Q_BG
#undef CONDITION_S_BG
    }